

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O0

void __thiscall
dap::
BasicTypeInfo<dap::optional<std::vector<dap::ExceptionOptions,_std::allocator<dap::ExceptionOptions>_>_>_>
::~BasicTypeInfo(BasicTypeInfo<dap::optional<std::vector<dap::ExceptionOptions,_std::allocator<dap::ExceptionOptions>_>_>_>
                 *this)

{
  BasicTypeInfo<dap::optional<std::vector<dap::ExceptionOptions,_std::allocator<dap::ExceptionOptions>_>_>_>
  *this_local;
  
  ~BasicTypeInfo(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

constexpr BasicTypeInfo(std::string&& name) : name_(std::move(name)) {}